

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O0

int Scl_CommandWriteConstr(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Scl_Con_t *p;
  char *pcVar3;
  int fVerbose;
  int c;
  char *pFileName;
  Scl_Con_t *pCon;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  p = Scl_ConGetMan(pAbc);
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"vh"), iVar2 != -1) {
    if ((iVar2 == 0x68) || (iVar2 != 0x76)) {
      fprintf((FILE *)pAbc->Err,"usage: write_constr [-vh] <file>\n");
      fprintf((FILE *)pAbc->Err,"\t         writes current timing constraints into a file\n");
      pcVar3 = "no";
      if (bVar1) {
        pcVar3 = "yes";
      }
      fprintf((FILE *)pAbc->Err,"\t-v     : toggle printing verbose information [default = %s]\n",
              pcVar3);
      fprintf((FILE *)pAbc->Err,"\t-h     : prints the command summary\n");
      fprintf((FILE *)pAbc->Err,"\t<file> : the name of a file to read\n");
      return 1;
    }
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (p == (Scl_Con_t *)0x0) {
    Abc_Print(1,"Scl_CommandWriteConstr(): There is no constraint manager.\n");
  }
  else {
    if (argc == globalUtilOptind + 1) {
      _fVerbose = argv[globalUtilOptind];
    }
    else {
      if ((argc != globalUtilOptind) || (p == (Scl_Con_t *)0x0)) {
        printf("Output file name should be given on the command line.\n");
        return 0;
      }
      _fVerbose = Extra_FileNameGenericAppend(p->pFileName,"_out.constr");
    }
    pcVar3 = Extra_FileNameExtension(_fVerbose);
    iVar2 = strcmp(pcVar3,"constr");
    if (iVar2 == 0) {
      Scl_ConWrite(p,_fVerbose);
    }
    else {
      printf("Scl_CommandWriteConstr(): Unrecognized output file extension.\n");
    }
  }
  return 0;
}

Assistant:

int Scl_CommandWriteConstr( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Scl_Con_t * pCon = Scl_ConGetMan( pAbc );
    char * pFileName = NULL;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pCon == NULL )
    {
        Abc_Print( 1, "Scl_CommandWriteConstr(): There is no constraint manager.\n" );
        return 0;
    }
    if ( argc == globalUtilOptind + 1 )
        pFileName = argv[globalUtilOptind];
    else if ( argc == globalUtilOptind && pCon )
        pFileName = Extra_FileNameGenericAppend( pCon->pFileName, "_out.constr" );
    else 
    {
        printf( "Output file name should be given on the command line.\n" );
        return 0;
    }
    // perform writing
    if ( !strcmp( Extra_FileNameExtension(pFileName), "constr" )  )
        Scl_ConWrite( pCon, pFileName );
    else 
    {
        printf( "Scl_CommandWriteConstr(): Unrecognized output file extension.\n" );
        return 0;
    }
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_constr [-vh] <file>\n" );
    fprintf( pAbc->Err, "\t         writes current timing constraints into a file\n" );
    fprintf( pAbc->Err, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\t<file> : the name of a file to read\n" );
    return 1;
}